

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseFaceChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  pointer pMVar1;
  pointer pFVar2;
  char *s1;
  pointer puVar3;
  char cVar4;
  ushort uVar5;
  uint _limit;
  uint32_t uVar6;
  int iVar7;
  Scene *pSVar8;
  Logger *pLVar9;
  DeadlyImportError *this_01;
  uint uVar10;
  uint32_t *puVar11;
  pointer pMVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  Chunk chunk;
  char *local_1c8 [4];
  string local_1a8 [11];
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
      uVar13 = chunk.Size - 6;
    } while ((int)uVar13 < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(*(int *)&this_00->current - *(int *)&this_00->buffer) + uVar13);
    pMVar1 = (this->mScene->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (chunk.Flag == 0x4130) {
      s1 = this->stream->current;
      do {
        cVar4 = StreamReader<false,_false>::Get<signed_char>(this->stream);
      } while (cVar4 != '\0');
      pSVar8 = this->mScene;
      iVar14 = 0;
      for (pMVar12 = (pSVar8->mMaterials).
                     super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pMVar12 !=
          (pSVar8->mMaterials).
          super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
          _M_impl.super__Vector_impl_data._M_finish; pMVar12 = pMVar12 + 1) {
        if ((pMVar12->mName)._M_string_length != 0) {
          iVar7 = ASSIMP_stricmp(s1,(pMVar12->mName)._M_dataplus._M_p);
          if (iVar7 == 0) {
            if (iVar14 != 0x32323233) {
              uVar13 = -iVar14;
              goto LAB_003cf9f0;
            }
            break;
          }
          pSVar8 = this->mScene;
        }
        iVar14 = iVar14 + -1;
      }
      pLVar9 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[24]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [24])"3DS: Unknown material: ");
      std::operator<<((ostream *)local_1a8,s1);
      std::__cxx11::stringbuf::str();
      Logger::error(pLVar9,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      uVar13 = 0xcdcdcdcd;
LAB_003cf9f0:
      uVar5 = StreamReader<false,_false>::Get<short>(this->stream);
      uVar10 = (uint)uVar5;
      while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
        uVar5 = StreamReader<false,_false>::Get<short>(this->stream);
        puVar3 = pMVar1[-1].mFaceMaterials.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)uVar5 <
            (ulong)((long)pMVar1[-1].mFaceMaterials.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar3 >> 2)) {
          puVar3[uVar5] = uVar13;
        }
        else {
          pLVar9 = DefaultLogger::get();
          Logger::error(pLVar9,"3DS: Invalid face index in face material list");
        }
      }
    }
    else if (chunk.Flag == 0x4150) {
      uVar15 = (ulong)(uVar13 >> 2);
      pFVar2 = pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
               super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                        super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4) < uVar15) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,"3DS: More smoothing groups than faces",
                   (allocator<char> *)local_1c8);
        DeadlyImportError::DeadlyImportError(this_01,local_1a8);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar11 = &(pFVar2->super_FaceWithSmoothingGroup).iSmoothGroup;
      while (iVar14 = (int)uVar15, uVar15 = (ulong)(iVar14 - 1), iVar14 != 0) {
        uVar6 = StreamReader<false,_false>::Get<int>(this->stream);
        *puVar11 = uVar6;
        puVar11 = puVar11 + 4;
      }
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
    if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseFaceChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // Get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_SMOOLIST:
        {
        // This is the list of smoothing groups - a bitfield for every face.
        // Up to 32 smoothing groups assigned to a single face.
        unsigned int num = chunkSize/4, m = 0;
        if (num > mMesh.mFaces.size())  {
            throw DeadlyImportError("3DS: More smoothing groups than faces");
        }
        for (std::vector<D3DS::Face>::iterator i =  mMesh.mFaces.begin(); m != num;++i, ++m)    {
            // nth bit is set for nth smoothing group
            (*i).iSmoothGroup = stream->GetI4();
        }}
        break;

    case Discreet3DS::CHUNK_FACEMAT:
        {
        // at fist an asciiz with the material name
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1());

        // find the index of the material
        unsigned int idx = 0xcdcdcdcd, cnt = 0;
        for (std::vector<D3DS::Material>::const_iterator i =  mScene->mMaterials.begin();i != mScene->mMaterials.end();++i,++cnt)   {
            // use case independent comparisons. hopefully it will work.
            if ((*i).mName.length() && !ASSIMP_stricmp(sz, (*i).mName.c_str())) {
                idx = cnt;
                break;
            }
        }
        if (0xcdcdcdcd == idx)  {
            ASSIMP_LOG_ERROR_F( "3DS: Unknown material: ", sz);
        }

        // Now continue and read all material indices
        cnt = (uint16_t)stream->GetI2();
        for (unsigned int i = 0; i < cnt;++i)   {
            unsigned int fidx = (uint16_t)stream->GetI2();

            // check range
            if (fidx >= mMesh.mFaceMaterials.size())    {
                ASSIMP_LOG_ERROR("3DS: Invalid face index in face material list");
            }
            else mMesh.mFaceMaterials[fidx] = idx;
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}